

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O3

size_t jessilib::starts_with_lengthi<char32_t,char32_t>
                 (basic_string_view<char32_t,_std::char_traits<char32_t>_> in_string,
                 basic_string_view<char32_t,_std::char_traits<char32_t>_> in_prefix)

{
  wchar32 wVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  
  sVar5 = in_prefix._M_len;
  if (in_string._M_len <= sVar5 - 1) {
    return 0;
  }
  sVar6 = 0;
  do {
    wVar1 = in_prefix._M_str[sVar6];
    if (in_string._M_str[sVar6] != wVar1) {
      iVar2 = jessilib::fold(in_string._M_str[sVar6]);
      iVar3 = jessilib::fold(wVar1);
      if (iVar2 != iVar3) {
        return 0;
      }
    }
    sVar6 = sVar6 + 1;
  } while (sVar5 != sVar6);
  sVar4 = 0;
  if (sVar5 == sVar6) {
    sVar4 = sVar5;
  }
  return sVar4;
}

Assistant:

size_t starts_with_lengthi(std::basic_string_view<LhsCharT> in_string, std::basic_string_view<RhsCharT> in_prefix) {
	// If in_string and in_prefix are the same type, skip decoding each point
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (in_string.size() < in_prefix.size()) {
			return 0;
		}
	}

	size_t codepoints_removed{};
	while (!in_string.empty() && !in_prefix.empty()) {
		decode_result string_front = decode_codepoint(in_string);
		decode_result prefix_front = decode_codepoint(in_prefix);

		if (string_front.units == 0
			|| prefix_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return 0;
		}

		if (!equalsi(string_front.codepoint, prefix_front.codepoint)) {
			// Codepoints don't fold to same value
			return 0;
		}

		// Codepoints are equal; trim off the fronts and continue
		in_string.remove_prefix(string_front.units);
		in_prefix.remove_prefix(prefix_front.units);
		codepoints_removed += string_front.units;
	}

	if (!in_prefix.empty()) {
		// We reached end of in_string before end of prefix
		return 0;
	}

	return codepoints_removed;
}